

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiImageClearingTests.cpp
# Opt level: O0

VkImageUsageFlags __thiscall
vkt::api::anon_unknown_0::ImageClearingTestInstance::getImageUsageFlags
          (ImageClearingTestInstance *this,VkFormat format)

{
  bool bVar1;
  VkImageUsageFlags commonFlags;
  VkFormat format_local;
  ImageClearingTestInstance *this_local;
  
  if ((this->m_isAttachmentFormat & 1U) == 0) {
    this_local._4_4_ = 3;
  }
  else {
    bVar1 = ::vk::isDepthStencilFormat(format);
    if (bVar1) {
      this_local._4_4_ = 0x23;
    }
    else {
      this_local._4_4_ = 0x13;
    }
  }
  return this_local._4_4_;
}

Assistant:

VkImageUsageFlags ImageClearingTestInstance::getImageUsageFlags (VkFormat format) const
{
	VkImageUsageFlags	commonFlags	= VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT;

	if (m_isAttachmentFormat)
	{
		if (isDepthStencilFormat(format))
			return commonFlags | VK_IMAGE_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT;

		return commonFlags | VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT;
	}
	return commonFlags;
}